

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.cc
# Opt level: O3

void Server::process_request_line(single_connection *conn)

{
  int iVar1;
  _Alloc_hider _Var2;
  int iVar3;
  char *__s;
  char *pcVar4;
  char *pcVar5;
  ulong uVar6;
  size_t __n;
  long lVar7;
  char *pcVar8;
  char local_168 [8];
  char temp_key [256];
  undefined1 local_58 [8];
  string temp_key_str;
  
  puts("------ REQUEST LINE PARSING START ------ ");
  conn->state = 4;
  pcVar8 = conn->querybuf;
  iVar3 = conn->query_start_index;
  pcVar4 = pcVar8 + iVar3;
  __s = strchr(pcVar4,0x20);
  if (__s == (char *)0x0) {
    pcVar4 = "[ERROR] Request method parsing failed ";
LAB_0010431a:
    puts(pcVar4);
    return;
  }
  pcVar5 = conn->method;
  __n = (size_t)((int)__s - (iVar3 + (int)pcVar8));
  strncpy(pcVar5,pcVar4,__n);
  printf("[Info] Request method: %s \n",pcVar5);
  lVar7 = (long)conn->query_start_index + __n + 1;
  conn->query_start_index = (int)lVar7;
  iVar3 = strcmp(pcVar5,"GET");
  if (iVar3 == 0) {
    local_58 = (undefined1  [8])&temp_key_str._M_string_length;
    temp_key_str._M_dataplus._M_p = (pointer)0x0;
    temp_key_str._M_string_length._0_1_ = 0;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::_M_erase_at_end(&query_list_abi_cxx11_,
                      query_list_abi_cxx11_.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start);
    pcVar4 = conn->querybuf;
    iVar3 = conn->query_start_index;
    temp_key_str.field_2._8_8_ = conn;
    pcVar8 = strchr(pcVar4 + iVar3,0x20);
    if (pcVar8 == (char *)0x0) {
      puts("[ERROR] Request uri parsing failed");
    }
    else {
      while ((__s = strchr(__s + 1,0x3d), __s != (char *)0x0 &&
             (pcVar8 != __s && -1 < (long)pcVar8 - (long)__s))) {
        pcVar5 = strchr(__s,0x26);
        iVar1 = (int)pcVar5;
        if (pcVar5 == (char *)0x0) {
          iVar1 = (int)pcVar8;
        }
        memset(local_168,0,0x100);
        strncpy(local_168,__s + 1,(long)(int)(iVar1 + ~(uint)__s));
        _Var2 = temp_key_str._M_dataplus;
        strlen(local_168);
        std::__cxx11::string::_M_replace((ulong)local_58,0,_Var2._M_p,(ulong)local_168);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(&query_list_abi_cxx11_,(value_type *)local_58);
      }
      printf("[INFO] Get %d key(s) from client \n",
             (long)query_list_abi_cxx11_.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)query_list_abi_cxx11_.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 5);
      if (query_list_abi_cxx11_.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish !=
          query_list_abi_cxx11_.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start) {
        lVar7 = 0;
        uVar6 = 0;
        do {
          uVar6 = uVar6 + 1;
          printf("[INFO] The key %d is %s \n",uVar6 & 0xffffffff,
                 *(undefined8 *)
                  ((long)&((query_list_abi_cxx11_.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p + lVar7));
          lVar7 = lVar7 + 0x20;
        } while (uVar6 < (ulong)((long)query_list_abi_cxx11_.
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)query_list_abi_cxx11_.
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start >> 5));
      }
      *(int *)(temp_key_str.field_2._8_8_ + 0x20) =
           *(int *)(temp_key_str.field_2._8_8_ + 0x20) + ((int)pcVar8 - (iVar3 + (int)pcVar4)) + 1;
    }
    conn = (single_connection *)temp_key_str.field_2._8_8_;
    if (local_58 != (undefined1  [8])&temp_key_str._M_string_length) {
      operator_delete((void *)local_58,
                      CONCAT71(temp_key_str._M_string_length._1_7_,
                               (undefined1)temp_key_str._M_string_length) + 1);
    }
    if (pcVar8 == (char *)0x0) {
      return;
    }
  }
  else {
    pcVar8 = conn->querybuf + lVar7;
    pcVar4 = strchr(pcVar8,0x20);
    if (pcVar4 == (char *)0x0) {
      pcVar4 = "[ERROR] Request uri parsing failed ";
      goto LAB_0010431a;
    }
    iVar3 = (int)pcVar4 - (int)pcVar8;
    strncpy(conn->uri,pcVar8,(long)iVar3);
    printf("[INFO] Request uri: %s \n",conn->uri);
    conn->query_start_index = conn->query_start_index + iVar3 + 1;
  }
  pcVar4 = conn->querybuf;
  pcVar8 = strchr(pcVar4,10);
  if (pcVar8 == (char *)0x0) {
    puts("[ERROR] Request version parsing failed ");
  }
  else {
    pcVar4 = pcVar4 + conn->query_start_index;
    iVar3 = (int)pcVar8 - (int)pcVar4;
    strncpy(conn->version,pcVar4,(long)(iVar3 + -1));
    printf("[INFO] Request version: %s \n",conn->version);
    conn->query_start_index = conn->query_start_index + iVar3 + 1;
    puts("------ REQUEST LINE PARSING END ------ ");
    process_head(conn);
  }
  return;
}

Assistant:

void Server::process_request_line(single_connection *conn)
{
    printf("------ REQUEST LINE PARSING START ------ \n");
    /* 连接状态为处理请求行 */
    conn->state = QUERY_LINE;

    /* 检验第一个空格的位置，用以定位请求方法 */
    char *ptr = strpbrk(conn->querybuf + conn->query_start_index, " ");
    if (!ptr)
    {
        printf("[ERROR] Request method parsing failed \n");
        return;
    }
    /* 请求方法长度 */
    int len = ptr - conn->querybuf - conn->query_start_index;
    /* 将请求方法复制到连接结构体中的method元素中 */
    strncpy(conn->method, conn->querybuf + conn->query_start_index, len);
    printf("[Info] Request method: %s \n", conn->method);
    /* 重新定位指针偏移量 */
    conn->query_start_index += (len + 1);

    /* 根据请求方法进行相应操作，当为GET时，将请求uri中的用户查询键分离出来后加入query_list中 */
    if (strcmp(conn->method, "GET") == 0)
    {
        /* key_len为各查询键的长度 */
        int key_len;
        /* 用户查询键临时变量 */
        char temp_key[256];
        /* 临时变量str类型 */
        string temp_key_str;
        /* 设置指针保存uri初始位置指针 */
        char *key_search_begin = NULL;
        /* findand为查询到的“&”的位置 */
        char *find_and = NULL;
        /* 清空query_list数组 */
        query_list.clear();
        /* 将uri初始位置指针赋值给key_search_begin */
        key_search_begin = ptr;
        /* 检验第二个空格的位置，用以定位请求uri */
        ptr = strpbrk(conn->querybuf + conn->query_start_index, " ");
        if (!ptr)
        {
            printf("[ERROR] Request uri parsing failed\n");
            return;
        }
        /* 目标资源uri长度 */
        len = ptr - conn->querybuf - conn->query_start_index;
        /* 将用户输入的查询串提取出键，放入query_list数组中 */
        while (true)
        {
            /* 定位“=”的位置 */
            key_search_begin = strpbrk(key_search_begin + 1, "=");
            /* 若该次查询到的等于号为空或其在ptr指针后，则退出循环 */
            if ((key_search_begin == NULL) || (ptr - key_search_begin <= 0))
            {
                /* 输出获得用户查询串中键的数量 */
                printf("[INFO] Get %d key(s) from client \n", query_list.size());
                break;
            }
            else
            {
                /* 定位“&”的位置 */
                find_and = strpbrk(key_search_begin, "&");
                /* 若该次查询到的“&”为空或其在ptr指针之后，则将其设为ptr */
                if ((find_and == NULL) || (ptr - find_and == 0))
                {
                    find_and = ptr;
                }
                /* 键长 */
                key_len = find_and - key_search_begin - 1;
                /* 拷贝键到temp_key */
                memset(temp_key, '\0', sizeof(temp_key));
                strncpy(temp_key, key_search_begin + 1, key_len);
                temp_key_str = temp_key;
                /* 向query_list添加键 */
                query_list.push_back(temp_key_str);
            }
        }
        /* 输出用户查询串中键的具体信息 */
        for (int i = 0; i < query_list.size(); i++)
        {
            printf("[INFO] The key %d is %s \n", i + 1, query_list[i].c_str());
        }
        conn->query_start_index += (len + 1);
    }
    /* 请求方法为非GET，此处为POST */
    else
    {
        ptr = strpbrk(conn->querybuf + conn->query_start_index, " ");
        if (!ptr)
        {
            printf("[ERROR] Request uri parsing failed \n");
            return;
        }
        /* 目标资源uri长度 */
        len = ptr - conn->querybuf - conn->query_start_index;
        strncpy(conn->uri, conn->querybuf + conn->query_start_index, len);

        printf("[INFO] Request uri: %s \n", conn->uri);

        conn->query_start_index += (len + 1);
    }

    /* 检验\n字符的位置，该行末尾为\r\n */
    ptr = strpbrk(conn->querybuf, "\n");
    if (!ptr)
    {
        printf("[ERROR] Request version parsing failed \n");
        return;
    }
    /* 客户端wget程序使用的HTTP版本号 */
    len = ptr - conn->querybuf - conn->query_start_index;
    /* 最后一个参数需要在原长度-1，即除去\r */
    strncpy(conn->version, conn->querybuf + conn->query_start_index, len - 1);

    printf("[INFO] Request version: %s \n", conn->version);

    conn->query_start_index += (len + 1);

    printf("------ REQUEST LINE PARSING END ------ \n");

    /* 解析请求头部 */
    process_head(conn);
}